

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Itemset.cc
# Opt level: O3

ostream * operator<<(ostream *outputStream,Itemset *itemset)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"ITEM: ",6);
  operator<<(outputStream,
             (itemset->theItemset).super___shared_ptr<Array,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"(",1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)outputStream,itemset->theSupport);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__ostream_insert<char,std::char_traits<char>>(outputStream,"\n",1);
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Itemset &itemset) {
    outputStream << "ITEM: ";
    outputStream << *itemset.theItemset;
    outputStream << "(" << itemset.theSupport << ")";
    outputStream << "\n";
    return outputStream;
}